

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

void __thiscall comparer_context::failure(comparer_context *this,string *err,string *name)

{
  compare_fails_exception *this_00;
  ostream *poVar1;
  reference pvVar2;
  char *msg;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  string *local_20;
  string *name_local;
  string *err_local;
  comparer_context *this_local;
  
  local_20 = name;
  name_local = err;
  err_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  this_00 = (compare_fails_exception *)__cxa_allocate_exception(0x1010);
  poVar1 = std::operator<<(local_198,"Files are different at ");
  pvVar2 = std::
           deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
           ::back(&this->history);
  poVar1 = std::operator<<(poVar1,(string *)pvVar2);
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = std::operator<<(poVar1,(string *)local_20);
  poVar1 = std::operator<<(poVar1,".\nError is: ");
  poVar1 = std::operator<<(poVar1,(string *)name_local);
  poVar1 = std::operator<<(poVar1,".\nCurrent position in scene hierarchy is ");
  print_hierarchy_abi_cxx11_(&local_1d8,this);
  std::operator<<(poVar1,(string *)&local_1d8);
  std::__cxx11::stringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  compare_fails_exception::compare_fails_exception(this_00,msg);
  __cxa_throw(this_00,&compare_fails_exception::typeinfo,
              compare_fails_exception::~compare_fails_exception);
}

Assistant:

AI_WONT_RETURN void failure(const std::string& err, const std::string& name) AI_WONT_RETURN_SUFFIX {
        std::stringstream ss;
        throw compare_fails_exception((ss
            << "Files are different at "
            << history.back().first
            << "."
            << name
            << ".\nError is: "
            << err
            << ".\nCurrent position in scene hierarchy is "
            << print_hierarchy(),ss.str().c_str()
            ));
    }